

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::EnsureLongBranch(ByteCodeWriter *this,OpCode op)

{
  ByteCodeLabel labelID;
  Type TVar1;
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  Type pJVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  ByteCodeLabel labelID_00;
  undefined4 *puVar7;
  Type *pTVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint firstUnknownJumpInfo;
  long lVar12;
  bool bVar13;
  uint local_3c;
  int local_38;
  
  if (this->useBranchIsland == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xb08,"(useBranchIsland)","useBranchIsland");
    if (!bVar5) {
LAB_0089622a:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  local_3c = (this->m_byteCodeData).currentOffset;
  if (((int)local_3c < this->nextBranchIslandOffset) || (this->inEnsureLongBranch == true)) {
    this->lastOpcode = op;
  }
  else {
    bVar5 = OpCodeAttr::HasFallThrough(this->lastOpcode);
    bVar13 = this->lastOpcode != Leave;
    this->lastOpcode = op;
    if ((((bVar13 && !bVar5) || (bVar6 = OpCodeAttr::HasFallThrough(op), bVar6)) ||
        (op == StatementBoundary)) || (op == Label)) {
      pLVar2 = this->m_jumpOffsets;
      lVar12 = (long)(int)this->firstUnknownJumpInfo;
      firstUnknownJumpInfo =
           (pLVar2->
           super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
           ).count;
      if ((int)this->firstUnknownJumpInfo < (int)firstUnknownJumpInfo) {
        local_38 = -1;
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          pJVar3 = (pLVar2->
                   super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                   ).buffer;
          uVar10 = pJVar3[lVar12].patchOffset;
          if ((ulong)(this->m_byteCodeData).currentOffset - 2 < (ulong)uVar10) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0xb28,
                                        "(jumpByteOffset <= this->m_byteCodeData.GetCurrentOffset() - sizeof(JumpOffset))"
                                        ,"Must have valid jump site within byte-code to back-patch")
            ;
            if (!bVar6) goto LAB_0089622a;
            *puVar7 = 0;
          }
          labelID = pJVar3[lVar12].labelId;
          CheckLabel(this,labelID);
          pTVar8 = JsUtil::
                   List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(this->m_labelOffsets,labelID);
          TVar1 = *pTVar8;
          if (TVar1 == 0xffffffff) {
            UpdateNextBranchIslandOffset(this,(uint)lVar12,uVar10);
            iVar11 = this->nextBranchIslandOffset;
            bVar6 = ConfigFlagsTable::IsEnabled
                              ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag);
            uVar10 = 0x4000;
            if (bVar6) {
              uVar10 = DAT_0159efb8;
              if ((int)DAT_0159efb8 < 0x41) {
                uVar10 = 0x40;
              }
              if (0x7fff < (int)uVar10) {
                uVar10 = 0x8000;
              }
              uVar10 = uVar10 >> 1;
            }
            if ((int)local_3c < (int)(iVar11 - uVar10)) goto LAB_0089615f;
            if (labelID == local_38) {
              if ((uint)lVar12 -
                  (this->m_jumpOffsets->
                  super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count != -1) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar7 = 1;
                bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                            ,0xb48,"(index == m_jumpOffsets->Count() - 1)",
                                            "index == m_jumpOffsets->Count() - 1");
                if (!bVar5) goto LAB_0089622a;
                *puVar7 = 0;
              }
              if ((int)local_3c < this->nextBranchIslandOffset) goto LAB_0089615f;
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar7 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0xb49,"(currentOffset < this->nextBranchIslandOffset)",
                                          "currentOffset < this->nextBranchIslandOffset");
              if (!bVar5) goto LAB_0089622a;
              *puVar7 = 0;
              goto LAB_0089615f;
            }
            this->inEnsureLongBranch = true;
            labelID_00 = DefineLabel(this);
            pJVar3[lVar12].labelId = labelID_00;
            if (local_38 == -1 && (!bVar13 || bVar5)) {
              local_38 = DefineLabel(this);
              Br(this,Br,local_38);
              if ((this->m_byteCodeData).currentOffset - local_3c != 3) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar7 = 1;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                            ,0xb5d,
                                            "(this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize)"
                                            ,
                                            "this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize"
                                           );
                if (!bVar6) goto LAB_0089622a;
                *puVar7 = 0;
              }
              local_3c = local_3c + 3;
            }
            MarkLabel(this,labelID_00);
            BrLong(this,BrLong,labelID);
            this->inEnsureLongBranch = false;
            if ((this->m_byteCodeData).currentOffset - local_3c != 7) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar7 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0xb6a,
                                          "(this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize)"
                                          ,
                                          "this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize"
                                         );
              if (!bVar6) goto LAB_0089622a;
              *puVar7 = 0;
            }
            local_3c = local_3c + 7;
          }
          else {
            bVar6 = ConfigFlagsTable::IsEnabled
                              ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag);
            uVar9 = 0x8000;
            if (bVar6) {
              uVar9 = DAT_0159efb8;
              if ((int)DAT_0159efb8 < 0x41) {
                uVar9 = 0x40;
              }
              if (0x7fff < (int)uVar9) {
                uVar9 = 0x8000;
              }
            }
            iVar11 = TVar1 - uVar10;
            if (iVar11 < (int)uVar9) {
              bVar6 = ConfigFlagsTable::IsEnabled
                                ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag)
              ;
              uVar10 = 0x8000;
              if (bVar6) {
                uVar10 = DAT_0159efb8;
                if ((int)DAT_0159efb8 < 0x41) {
                  uVar10 = 0x40;
                }
                if (0x7fff < (int)uVar10) {
                  uVar10 = 0x8000;
                }
              }
              if (SBORROW4(iVar11,-uVar10) == (int)(iVar11 + uVar10) < 0) goto LAB_00896134;
            }
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar7 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0xb34,
                                        "((int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit() && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit())"
                                        ,
                                        "(int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit() && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit()"
                                       );
            if (!bVar6) goto LAB_0089622a;
            *puVar7 = 0;
          }
LAB_00896134:
          lVar12 = lVar12 + 1;
        } while (lVar12 < (pLVar2->
                          super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                          ).count);
        firstUnknownJumpInfo =
             (this->m_jumpOffsets->
             super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
             ).count;
      }
      else {
        local_38 = -1;
      }
      UpdateNextBranchIslandOffset(this,firstUnknownJumpInfo,local_3c);
LAB_0089615f:
      if (local_38 != -1) {
        MarkLabel(this,local_38);
        return;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::EnsureLongBranch(Js::OpCode op)
    {
        Assert(useBranchIsland);
        int currentOffset = this->m_byteCodeData.GetCurrentOffset();

        // See if we need to emit branch island yet, and avoid recursion.
        if (currentOffset < this->nextBranchIslandOffset || this->inEnsureLongBranch)
        {
            lastOpcode = op;
            return;
        }

        // Leave actually may continue right after, it is only no fall through in the JIT.
        bool needBranchAround = OpCodeAttr::HasFallThrough(lastOpcode) || lastOpcode == Js::OpCode::Leave;
        lastOpcode = op;

        // If we are about to emit a no fall through op and the last was has fall through
        // then just emit the no fall through op, and then we can skip the branch around.
        // Except at label or StatementBoundary, we always want to emit before them.
        if ((needBranchAround && !OpCodeAttr::HasFallThrough(op))
            && op != Js::OpCode::StatementBoundary && op != Js::OpCode::Label)
        {
            return;
        }

        ByteCodeLabel branchAroundLabel = (Js::ByteCodeLabel)-1;
        bool foundUnknown = m_jumpOffsets->MapUntilFrom(firstUnknownJumpInfo,
            [=, &branchAroundLabel, &currentOffset](int index, JumpInfo& jumpInfo)
        {
            //
            // Read "labelID" stored at the offset within the byte-code.
            //
            uint jumpByteOffset = jumpInfo.patchOffset;
            AssertMsg(jumpByteOffset <= this->m_byteCodeData.GetCurrentOffset() - sizeof(JumpOffset),
                "Must have valid jump site within byte-code to back-patch");

            ByteCodeLabel labelID = jumpInfo.labelId;
            CheckLabel(labelID);

            // See if the label has bee marked yet.
            uint const labelByteOffset = m_labelOffsets->Item(labelID);
            if (labelByteOffset != UINT_MAX)
            {
                // If a label is already defined, then it should be short
                // (otherwise we should have emitted a branch island for it already).
                Assert((int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit()
                    && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit());
                return false;
            }

            this->UpdateNextBranchIslandOffset(index, jumpByteOffset);
            // Flush all the jump that are half of the way to the limit as well so we don't have
            // as many jump around of branch island.
            int flushNextBranchIslandOffset = this->nextBranchIslandOffset - GetBranchLimit() / 2;
            if (currentOffset < flushNextBranchIslandOffset)
            {
                // No need to for long branch yet. Terminate the loop.
                return true;
            }

            if (labelID == branchAroundLabel)
            {
                // Let's not flush the branchAroundLabel.
                // Should happen very rarely and mostly when the branch limit is very small.

                // This should be the last short jump we have just emitted (below).
                Assert(index == m_jumpOffsets->Count() - 1);
                Assert(currentOffset < this->nextBranchIslandOffset);
                return true;
            }

            // Emit long branch

            // Prevent recursion when we emit byte code here
            this->inEnsureLongBranch = true;

            // Create the branch label and update the jumpInfo.
            // Need to update the jumpInfo before we add the branch island as that might resize the m_jumpOffsets list.
            ByteCodeLabel longBranchLabel = this->DefineLabel();
            jumpInfo.labelId = longBranchLabel;

            // Emit the branch around if it hasn't been emitted already
            if (branchAroundLabel == (Js::ByteCodeLabel)-1 && needBranchAround)
            {
                branchAroundLabel = this->DefineLabel();
                this->Br(Js::OpCode::Br, branchAroundLabel);

                Assert(this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize);
                currentOffset += JumpAroundSize;

                // Continue to count he jumpAroundSize, because we may have to emit
                // yet another branch island right after if the jumpAroundSize is included.
            }

            // Emit the long branch
            this->MarkLabel(longBranchLabel);
            this->BrLong(Js::OpCode::BrLong, labelID);

            this->inEnsureLongBranch = false;

            Assert(this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize);
            currentOffset += LongBranchSize;
            return false;
        });

        if (!foundUnknown)
        {
            // Nothing is found, just set the next branch island from the current offset
            this->UpdateNextBranchIslandOffset(this->m_jumpOffsets->Count(), currentOffset);
        }

        if (branchAroundLabel != (Js::ByteCodeLabel)-1)
        {
            // Make the branch around label if we needed one
            this->MarkLabel(branchAroundLabel);
        }
    }